

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_test.cc
# Opt level: O1

void __thiscall CipherTest_GCMIncrementingIV_Test::TestBody(CipherTest_GCMIncrementingIV_Test *this)

{
  uint uVar1;
  uint uVar2;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  dVar3;
  bool bVar4;
  int iVar5;
  pointer *__ptr;
  AssertHelperData *__ptr_00;
  AssertHelper *this_00;
  char *pcVar6;
  char *in_R9;
  pointer *__ptr_3;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  internal iVar7;
  Span<const_unsigned_char> iv_00;
  Span<const_unsigned_char> iv_01;
  Span<const_unsigned_char> iv_02;
  Span<const_unsigned_char> iv_03;
  Span<const_unsigned_char> iv_04;
  Span<const_unsigned_char> iv_05;
  Span<const_unsigned_char> iv_06;
  Span<const_unsigned_char> iv_07;
  Span<const_unsigned_char> iv_08;
  Span<const_unsigned_char> iv_09;
  Span<const_unsigned_char> iv_10;
  Span<const_unsigned_char> iv_11;
  Span<const_unsigned_char> iv_12;
  Span<const_unsigned_char> iv_13;
  Span<const_unsigned_char> iv_14;
  Span<const_unsigned_char> iv_15;
  Span<const_unsigned_char> iv_16;
  Span<const_unsigned_char> iv_17;
  AssertionResult gtest_ar__18;
  AssertionResult gtest_ar_;
  uint8_t suffix [8];
  AssertionResult gtest_ar;
  uint8_t iv [12];
  uint8_t counter2_1 [8];
  anon_class_8_1_17e5c936 expect_iv;
  EVP_CIPHER *kCipher;
  uint8_t kFixedIV [4];
  ScopedEVP_CIPHER_CTX ctx;
  undefined1 local_138 [8];
  undefined4 local_130;
  undefined4 uStack_12c;
  undefined1 local_128 [8];
  AssertHelperData *pAStack_120;
  AssertHelper local_118;
  undefined1 local_110 [8];
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  Bytes local_f0;
  AssertHelper local_e0;
  anon_class_8_1_17e5c936 local_d8;
  AssertHelper local_d0;
  EVP_CIPHER *local_c8;
  AssertHelper local_c0;
  EVP_CIPHER_CTX local_b8;
  
  local_c8 = EVP_aes_128_gcm();
  local_d8.kCipher = (EVP_CIPHER **)&local_c8;
  EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)&local_b8);
  iVar5 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)&local_b8,local_c8,(ENGINE *)0x0,"",(uchar *)0x0);
  iVar7 = (internal)(iVar5 != 0);
  pAStack_120 = (AssertHelperData *)0x0;
  local_128[0] = iVar7;
  if (iVar5 == 0) {
    testing::Message::Message((Message *)local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_128,
               (AssertionResult *)"EVP_EncryptInit_ex(ctx.get(), kCipher, nullptr, kKey, nullptr)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x2c8,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)local_138);
LAB_002427de:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._1_7_,local_110[0]) != &local_100) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_110._1_7_,local_110[0]),local_100._M_allocated_capacity + 1)
      ;
    }
    if ((long *)CONCAT44(local_138._4_4_,local_138._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_138._4_4_,local_138._0_4_) + 8))();
    }
    if (pAStack_120 != (AssertHelperData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pAStack_120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAStack_120)
      ;
    }
    EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&local_b8);
    return;
  }
  iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x12,-1,
                              "\x01\x02\x03\x04\x05\x06\a\b\t\n\v\f");
  local_128[0] = (internal)(iVar5 != 0);
  pAStack_120 = (AssertHelperData *)0x0;
  if (!(bool)local_128[0]) {
    testing::Message::Message((Message *)local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_128,
               (AssertionResult *)
               "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x12, -1, const_cast<uint8_t *>(kIV1))","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x2ca,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)local_138);
    goto LAB_002427de;
  }
  iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x13,0xc,&local_f0);
  local_128[0] = (internal)(iVar5 != 0);
  pAStack_120 = (AssertHelperData *)0x0;
  if (iVar5 == 0) {
    testing::Message::Message((Message *)local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_128,
               (AssertionResult *)"EVP_CIPHER_CTX_ctrl(ctx.get(), 0x13, sizeof(iv), iv)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x2cf,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=(&local_118,(Message *)local_138);
LAB_00242894:
    this_00 = &local_118;
LAB_00242899:
    testing::internal::AssertHelper::~AssertHelper(this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._1_7_,local_110[0]) != &local_100) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_110._1_7_,local_110[0]),local_100._M_allocated_capacity + 1)
      ;
    }
    if ((long *)CONCAT44(local_138._4_4_,local_138._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_138._4_4_,local_138._0_4_) + 8))();
    }
    if (pAStack_120 != (AssertHelperData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pAStack_120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAStack_120)
      ;
    }
LAB_002429e6:
    bVar4 = false;
  }
  else {
    pAStack_120 = (AssertHelperData *)&DAT_0000000c;
    local_138._0_4_ = 0x545aa0;
    local_138._4_4_ = 0;
    local_130 = 0xc;
    uStack_12c = 0;
    local_128 = (undefined1  [8])&local_f0;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_110,"Bytes(iv)","Bytes(kIV1)",(Bytes *)local_128,(Bytes *)local_138
              );
    if (local_110[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_128);
      if ((undefined8 *)CONCAT71(local_108._1_7_,local_108[0]) == (undefined8 *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)CONCAT71(local_108._1_7_,local_108[0]);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x2d0,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_128);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
      if (local_128 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_128 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT71(local_108._1_7_,local_108[0]) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT71(local_108._1_7_,local_108[0]));
    }
    bVar4 = testing::internal::AlwaysTrue();
    if (!bVar4) {
LAB_00242991:
      testing::Message::Message((Message *)local_110);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_128,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x2d1,
                 "Expected: expect_iv(ctx.get(), kIV1, true) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)local_128,(Message *)local_110);
LAB_002429cc:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_128);
      if ((long *)CONCAT71(local_110._1_7_,local_110[0]) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_110._1_7_,local_110[0]) + 8))();
      }
      goto LAB_002429e6;
    }
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      iv_00.size_ = 0xc;
      iv_00.data_ = "\x01\x02\x03\x04\x05\x06\a\b\t\n\v\f";
      TestBody::anon_class_8_1_17e5c936::operator()(&local_d8,&local_b8,iv_00,true);
    }
    dVar3 = local_108[0];
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    if (dVar3 != (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0) goto LAB_00242991;
    iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x13,0xc,&local_f0);
    local_128[0] = (internal)(iVar5 != 0);
    pAStack_120 = (AssertHelperData *)0x0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)local_138);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_110,(internal *)local_128,
                 (AssertionResult *)"EVP_CIPHER_CTX_ctrl(ctx.get(), 0x13, sizeof(iv), iv)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x2d5,(char *)CONCAT71(local_110._1_7_,local_110[0]));
      testing::internal::AssertHelper::operator=(&local_118,(Message *)local_138);
      goto LAB_00242894;
    }
    pAStack_120 = (AssertHelperData *)&DAT_0000000c;
    local_138._0_4_ = 0x545a05;
    local_138._4_4_ = 0;
    local_130 = 0xc;
    uStack_12c = 0;
    local_128 = (undefined1  [8])&local_f0;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_110,"Bytes(iv)","Bytes(kIV2)",(Bytes *)local_128,(Bytes *)local_138
              );
    if (local_110[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_128);
      if ((undefined8 *)CONCAT71(local_108._1_7_,local_108[0]) == (undefined8 *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)CONCAT71(local_108._1_7_,local_108[0]);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x2d6,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_128);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
      if (local_128 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_128 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT71(local_108._1_7_,local_108[0]) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT71(local_108._1_7_,local_108[0]));
    }
    bVar4 = testing::internal::AlwaysTrue();
    if (!bVar4) {
LAB_00243246:
      testing::Message::Message((Message *)local_110);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_128,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x2d7,
                 "Expected: expect_iv(ctx.get(), kIV2, true) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)local_128,(Message *)local_110);
      goto LAB_002429cc;
    }
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      iv_02.size_ = 0xc;
      iv_02.data_ = "\x01\x02\x03\x04\x05\x06\a\b\t\n\v\r";
      TestBody::anon_class_8_1_17e5c936::operator()(&local_d8,&local_b8,iv_02,true);
    }
    dVar3 = local_108[0];
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    if (dVar3 != (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0) goto LAB_00243246;
    iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x13,8,&local_118);
    local_128[0] = (internal)(iVar5 != 0);
    pAStack_120 = (AssertHelperData *)0x0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)local_138);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_110,(internal *)local_128,
                 (AssertionResult *)"EVP_CIPHER_CTX_ctrl(ctx.get(), 0x13, sizeof(suffix), suffix)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x2dc,(char *)CONCAT71(local_110._1_7_,local_110[0]));
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_138);
LAB_0024348e:
      this_00 = &local_e0;
      goto LAB_00242899;
    }
    pAStack_120 = (AssertHelperData *)&DAT_00000008;
    local_138._0_4_ = 0x545a15;
    local_138._4_4_ = 0;
    local_130 = 8;
    uStack_12c = 0;
    local_128 = (undefined1  [8])&local_118;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_110,"Bytes(suffix)","Bytes(bssl::Span(kIV3).last(sizeof(suffix)))",
               (Bytes *)local_128,(Bytes *)local_138);
    if (local_110[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_128);
      if ((undefined8 *)CONCAT71(local_108._1_7_,local_108[0]) == (undefined8 *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)CONCAT71(local_108._1_7_,local_108[0]);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x2dd,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_128);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
      if (local_128 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_128 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT71(local_108._1_7_,local_108[0]) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT71(local_108._1_7_,local_108[0]));
    }
    bVar4 = testing::internal::AlwaysTrue();
    if (!bVar4) {
LAB_002439e0:
      testing::Message::Message((Message *)local_110);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_128,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x2de,
                 "Expected: expect_iv(ctx.get(), kIV3, true) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)local_128,(Message *)local_110);
      goto LAB_002429cc;
    }
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      iv_05.size_ = 0xc;
      iv_05.data_ = "\x01\x02\x03\x04\x05\x06\a\b\t\n\v\x0e";
      TestBody::anon_class_8_1_17e5c936::operator()(&local_d8,&local_b8,iv_05,true);
    }
    dVar3 = local_108[0];
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    if (dVar3 != (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0) goto LAB_002439e0;
    iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x13,-1,&local_f0);
    local_128[0] = (internal)(iVar5 != 0);
    pAStack_120 = (AssertHelperData *)0x0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)local_138);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_110,(internal *)local_128,
                 (AssertionResult *)"EVP_CIPHER_CTX_ctrl(ctx.get(), 0x13, -1, iv)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x2e1,(char *)CONCAT71(local_110._1_7_,local_110[0]));
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_138);
      goto LAB_0024348e;
    }
    pAStack_120 = (AssertHelperData *)&DAT_0000000c;
    local_138._0_4_ = 0x545a1d;
    local_138._4_4_ = 0;
    local_130 = 0xc;
    uStack_12c = 0;
    local_128 = (undefined1  [8])&local_f0;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_110,"Bytes(iv)","Bytes(kIV4)",(Bytes *)local_128,(Bytes *)local_138
              );
    if (local_110[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_128);
      if ((undefined8 *)CONCAT71(local_108._1_7_,local_108[0]) == (undefined8 *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)CONCAT71(local_108._1_7_,local_108[0]);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x2e2,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_128);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
      if (local_128 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_128 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT71(local_108._1_7_,local_108[0]) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT71(local_108._1_7_,local_108[0]));
    }
    bVar4 = testing::internal::AlwaysTrue();
    if (!bVar4) {
LAB_00244308:
      testing::Message::Message((Message *)local_110);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_128,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x2e3,
                 "Expected: expect_iv(ctx.get(), kIV4, true) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)local_128,(Message *)local_110);
      goto LAB_002429cc;
    }
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      iv_09.size_ = 0xc;
      iv_09.data_ = "\x01\x02\x03\x04\x05\x06\a\b\t\n\v\x0f";
      TestBody::anon_class_8_1_17e5c936::operator()(&local_d8,&local_b8,iv_09,true);
    }
    dVar3 = local_108[0];
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    bVar4 = true;
    if (dVar3 != (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0) goto LAB_00244308;
  }
  EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&local_b8);
  if (!bVar4) {
    return;
  }
  EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)&local_b8);
  iVar5 = EVP_DecryptInit_ex((EVP_CIPHER_CTX *)&local_b8,local_c8,(ENGINE *)0x0,"",(uchar *)0x0);
  iVar7 = (internal)(iVar5 != 0);
  pAStack_120 = (AssertHelperData *)0x0;
  local_128[0] = iVar7;
  if (iVar5 == 0) {
    testing::Message::Message((Message *)local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_128,
               (AssertionResult *)"EVP_DecryptInit_ex(ctx.get(), kCipher, nullptr, kKey, nullptr)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x2ed,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)local_138);
LAB_00242c61:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._1_7_,local_110[0]) != &local_100) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_110._1_7_,local_110[0]),local_100._M_allocated_capacity + 1)
      ;
    }
    if ((long *)CONCAT44(local_138._4_4_,local_138._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_138._4_4_,local_138._0_4_) + 8))();
    }
    if (pAStack_120 != (AssertHelperData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pAStack_120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAStack_120)
      ;
    }
    EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&local_b8);
    return;
  }
  iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x12,-1,
                              "\x01\x02\x03\x04\x05\x06\a\b\t\n\v\f");
  local_128[0] = (internal)(iVar5 != 0);
  pAStack_120 = (AssertHelperData *)0x0;
  if (!(bool)local_128[0]) {
    testing::Message::Message((Message *)local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_128,
               (AssertionResult *)
               "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x12, -1, const_cast<uint8_t *>(kIV1))","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x2ef,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)local_138);
    goto LAB_00242c61;
  }
  iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x13,0xc,&local_f0);
  local_128[0] = (internal)(iVar5 != 0);
  pAStack_120 = (AssertHelperData *)0x0;
  if (iVar5 == 0) {
    testing::Message::Message((Message *)local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_128,
               (AssertionResult *)"EVP_CIPHER_CTX_ctrl(ctx.get(), 0x13, sizeof(iv), iv)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x2f3,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=(&local_118,(Message *)local_138);
LAB_00242d17:
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._1_7_,local_110[0]) != &local_100) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_110._1_7_,local_110[0]),local_100._M_allocated_capacity + 1)
      ;
    }
    if ((long *)CONCAT44(local_138._4_4_,local_138._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_138._4_4_,local_138._0_4_) + 8))();
    }
    if (pAStack_120 != (AssertHelperData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pAStack_120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAStack_120)
      ;
    }
LAB_00242ec9:
    bVar4 = false;
  }
  else {
    pAStack_120 = (AssertHelperData *)&DAT_0000000c;
    local_138._0_4_ = 0x545a29;
    local_138._4_4_ = 0;
    local_130 = 0xc;
    uStack_12c = 0;
    local_128 = (undefined1  [8])&local_f0;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_110,"Bytes(iv)","Bytes(kIV1)",(Bytes *)local_128,(Bytes *)local_138
              );
    if (local_110[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_128);
      if ((undefined8 *)CONCAT71(local_108._1_7_,local_108[0]) == (undefined8 *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)CONCAT71(local_108._1_7_,local_108[0]);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x2f4,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_128);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
      if (local_128 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_128 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT71(local_108._1_7_,local_108[0]) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT71(local_108._1_7_,local_108[0]));
    }
    bVar4 = testing::internal::AlwaysTrue();
    if (!bVar4) {
LAB_00242e74:
      testing::Message::Message((Message *)local_110);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_128,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x2f5,
                 "Expected: expect_iv(ctx.get(), kIV1, false) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)local_128,(Message *)local_110);
LAB_00242eaf:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_128);
      if ((long *)CONCAT71(local_110._1_7_,local_110[0]) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_110._1_7_,local_110[0]) + 8))();
      }
      goto LAB_00242ec9;
    }
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      iv_01.size_ = 0xc;
      iv_01.data_ = "\x01\x02\x03\x04\x05\x06\a\b\t\n\v\f";
      TestBody::anon_class_8_1_17e5c936::operator()(&local_d8,&local_b8,iv_01,false);
    }
    dVar3 = local_108[0];
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    if (dVar3 != (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0) goto LAB_00242e74;
    iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x13,0xc,&local_f0);
    local_128[0] = (internal)(iVar5 != 0);
    pAStack_120 = (AssertHelperData *)0x0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)local_138);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_110,(internal *)local_128,
                 (AssertionResult *)"EVP_CIPHER_CTX_ctrl(ctx.get(), 0x13, sizeof(iv), iv)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x2f8,(char *)CONCAT71(local_110._1_7_,local_110[0]));
      testing::internal::AssertHelper::operator=(&local_118,(Message *)local_138);
      goto LAB_00242d17;
    }
    pAStack_120 = (AssertHelperData *)&DAT_0000000c;
    local_138._0_4_ = 0x545a35;
    local_138._4_4_ = 0;
    local_130 = 0xc;
    uStack_12c = 0;
    local_128 = (undefined1  [8])&local_f0;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_110,"Bytes(iv)","Bytes(kIV2)",(Bytes *)local_128,(Bytes *)local_138
              );
    if (local_110[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_128);
      if ((undefined8 *)CONCAT71(local_108._1_7_,local_108[0]) == (undefined8 *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)CONCAT71(local_108._1_7_,local_108[0]);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x2f9,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_128);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
      if (local_128 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_128 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT71(local_108._1_7_,local_108[0]) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT71(local_108._1_7_,local_108[0]));
    }
    bVar4 = testing::internal::AlwaysTrue();
    if (!bVar4) {
LAB_002438f6:
      testing::Message::Message((Message *)local_110);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_128,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x2fa,
                 "Expected: expect_iv(ctx.get(), kIV2, false) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)local_128,(Message *)local_110);
      goto LAB_00242eaf;
    }
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      iv_04.size_ = 0xc;
      iv_04.data_ = "\x01\x02\x03\x04\x05\x06\a\b\t\n\v\r";
      TestBody::anon_class_8_1_17e5c936::operator()(&local_d8,&local_b8,iv_04,false);
    }
    dVar3 = local_108[0];
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    bVar4 = true;
    if (dVar3 != (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0) goto LAB_002438f6;
  }
  EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&local_b8);
  if (!bVar4) {
    return;
  }
  EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)&local_b8);
  iVar5 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)&local_b8,local_c8,(ENGINE *)0x0,"",(uchar *)0x0);
  iVar7 = (internal)(iVar5 != 0);
  pAStack_120 = (AssertHelperData *)0x0;
  local_128[0] = iVar7;
  if (iVar5 == 0) {
    testing::Message::Message((Message *)local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_128,
               (AssertionResult *)"EVP_EncryptInit_ex(ctx.get(), kCipher, nullptr, kKey, nullptr)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x308,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)local_138);
LAB_00243144:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._1_7_,local_110[0]) != &local_100) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_110._1_7_,local_110[0]),local_100._M_allocated_capacity + 1)
      ;
    }
    if ((long *)CONCAT44(local_138._4_4_,local_138._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_138._4_4_,local_138._0_4_) + 8))();
    }
    if (pAStack_120 != (AssertHelperData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pAStack_120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAStack_120)
      ;
    }
    EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&local_b8);
    return;
  }
  iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x12,-1,TestBody()::kIV1);
  local_128[0] = (internal)(iVar5 != 0);
  pAStack_120 = (AssertHelperData *)0x0;
  if (!(bool)local_128[0]) {
    testing::Message::Message((Message *)local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_128,
               (AssertionResult *)
               "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x12, -1, const_cast<uint8_t *>(kIV1))","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x30a,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)local_138);
    goto LAB_00243144;
  }
  iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x13,0xc,&local_f0);
  local_128[0] = (internal)(iVar5 != 0);
  pAStack_120 = (AssertHelperData *)0x0;
  if (iVar5 == 0) {
    testing::Message::Message((Message *)local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_128,
               (AssertionResult *)"EVP_CIPHER_CTX_ctrl(ctx.get(), 0x13, sizeof(iv), iv)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x30e,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=(&local_118,(Message *)local_138);
LAB_0024337e:
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._1_7_,local_110[0]) != &local_100) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_110._1_7_,local_110[0]),local_100._M_allocated_capacity + 1)
      ;
    }
    if ((long *)CONCAT44(local_138._4_4_,local_138._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_138._4_4_,local_138._0_4_) + 8))();
    }
    if (pAStack_120 != (AssertHelperData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pAStack_120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAStack_120)
      ;
    }
LAB_0024359b:
    bVar4 = false;
  }
  else {
    pAStack_120 = (AssertHelperData *)&DAT_0000000c;
    local_138._0_4_ = 0x545a41;
    local_138._4_4_ = 0;
    local_130 = 0xc;
    uStack_12c = 0;
    local_128 = (undefined1  [8])&local_f0;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_110,"Bytes(iv)","Bytes(kIV1)",(Bytes *)local_128,(Bytes *)local_138
              );
    if (local_110[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_128);
      if ((undefined8 *)CONCAT71(local_108._1_7_,local_108[0]) == (undefined8 *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)CONCAT71(local_108._1_7_,local_108[0]);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x30f,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_128);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
      if (local_128 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_128 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT71(local_108._1_7_,local_108[0]) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT71(local_108._1_7_,local_108[0]));
    }
    bVar4 = testing::internal::AlwaysTrue();
    if (!bVar4) {
LAB_00243546:
      testing::Message::Message((Message *)local_110);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_128,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x310,
                 "Expected: expect_iv(ctx.get(), kIV1, true) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)local_128,(Message *)local_110);
LAB_00243581:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_128);
      if ((long *)CONCAT71(local_110._1_7_,local_110[0]) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_110._1_7_,local_110[0]) + 8))();
      }
      goto LAB_0024359b;
    }
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      iv_03.size_ = 0xc;
      iv_03.data_ = TestBody()::kIV1;
      TestBody::anon_class_8_1_17e5c936::operator()(&local_d8,&local_b8,iv_03,true);
    }
    dVar3 = local_108[0];
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    if (dVar3 != (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0) goto LAB_00243546;
    iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x13,0xc,&local_f0);
    local_128[0] = (internal)(iVar5 != 0);
    pAStack_120 = (AssertHelperData *)0x0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)local_138);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_110,(internal *)local_128,
                 (AssertionResult *)"EVP_CIPHER_CTX_ctrl(ctx.get(), 0x13, sizeof(iv), iv)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x313,(char *)CONCAT71(local_110._1_7_,local_110[0]));
      testing::internal::AssertHelper::operator=(&local_118,(Message *)local_138);
      goto LAB_0024337e;
    }
    pAStack_120 = (AssertHelperData *)&DAT_0000000c;
    local_138._0_4_ = 0x545a4d;
    local_138._4_4_ = 0;
    local_130 = 0xc;
    uStack_12c = 0;
    local_128 = (undefined1  [8])&local_f0;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_110,"Bytes(iv)","Bytes(kIV2)",(Bytes *)local_128,(Bytes *)local_138
              );
    if (local_110[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_128);
      if ((undefined8 *)CONCAT71(local_108._1_7_,local_108[0]) == (undefined8 *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)CONCAT71(local_108._1_7_,local_108[0]);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x314,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_128);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
      if (local_128 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_128 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT71(local_108._1_7_,local_108[0]) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT71(local_108._1_7_,local_108[0]));
    }
    bVar4 = testing::internal::AlwaysTrue();
    if (!bVar4) {
LAB_00243d99:
      testing::Message::Message((Message *)local_110);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_128,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x315,
                 "Expected: expect_iv(ctx.get(), kIV2, true) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)local_128,(Message *)local_110);
      goto LAB_00243581;
    }
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      iv_06.size_ = 0xc;
      iv_06.data_ = TestBody()::kIV2;
      TestBody::anon_class_8_1_17e5c936::operator()(&local_d8,&local_b8,iv_06,true);
    }
    dVar3 = local_108[0];
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    if (dVar3 != (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0) goto LAB_00243d99;
    iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x13,0xc,&local_f0);
    local_128[0] = (internal)(iVar5 != 0);
    pAStack_120 = (AssertHelperData *)0x0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)local_138);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_110,(internal *)local_128,
                 (AssertionResult *)"EVP_CIPHER_CTX_ctrl(ctx.get(), 0x13, sizeof(iv), iv)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x318,(char *)CONCAT71(local_110._1_7_,local_110[0]));
      testing::internal::AssertHelper::operator=(&local_118,(Message *)local_138);
      goto LAB_0024337e;
    }
    pAStack_120 = (AssertHelperData *)&DAT_0000000c;
    local_138._0_4_ = 0x545a59;
    local_138._4_4_ = 0;
    local_130 = 0xc;
    uStack_12c = 0;
    local_128 = (undefined1  [8])&local_f0;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_110,"Bytes(iv)","Bytes(kIV3)",(Bytes *)local_128,(Bytes *)local_138
              );
    if (local_110[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_128);
      if ((undefined8 *)CONCAT71(local_108._1_7_,local_108[0]) == (undefined8 *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)CONCAT71(local_108._1_7_,local_108[0]);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x319,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_128);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
      if (local_128 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_128 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT71(local_108._1_7_,local_108[0]) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT71(local_108._1_7_,local_108[0]));
    }
    bVar4 = testing::internal::AlwaysTrue();
    if (!bVar4) {
LAB_00244837:
      testing::Message::Message((Message *)local_110);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_128,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x31a,
                 "Expected: expect_iv(ctx.get(), kIV3, true) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)local_128,(Message *)local_110);
      goto LAB_00243581;
    }
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      iv_11.size_ = 0xc;
      iv_11.data_ = TestBody()::kIV3;
      TestBody::anon_class_8_1_17e5c936::operator()(&local_d8,&local_b8,iv_11,true);
    }
    dVar3 = local_108[0];
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    bVar4 = true;
    if (dVar3 != (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0) goto LAB_00244837;
  }
  EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&local_b8);
  if (!bVar4) {
    return;
  }
  EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)&local_b8);
  iVar5 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)&local_b8,local_c8,(ENGINE *)0x0,"",(uchar *)0x0);
  iVar7 = (internal)(iVar5 != 0);
  pAStack_120 = (AssertHelperData *)0x0;
  local_128[0] = iVar7;
  if (iVar5 == 0) {
    testing::Message::Message((Message *)local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_128,
               (AssertionResult *)"EVP_EncryptInit_ex(ctx.get(), kCipher, nullptr, kKey, nullptr)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x32b,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)local_138);
LAB_00243b18:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._1_7_,local_110[0]) != &local_100) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_110._1_7_,local_110[0]),local_100._M_allocated_capacity + 1)
      ;
    }
    if ((long *)CONCAT44(local_138._4_4_,local_138._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_138._4_4_,local_138._0_4_) + 8))();
    }
    if (pAStack_120 != (AssertHelperData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pAStack_120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAStack_120)
      ;
    }
    EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&local_b8);
    return;
  }
  iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,9,0x10,(void *)0x0);
  local_128[0] = (internal)(iVar5 != 0);
  pAStack_120 = (AssertHelperData *)0x0;
  if (iVar5 == 0) {
    testing::Message::Message((Message *)local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_128,
               (AssertionResult *)"EVP_CIPHER_CTX_ctrl(ctx.get(), 0x9, sizeof(kIV1), nullptr)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x32d,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)local_138);
    goto LAB_00243b18;
  }
  iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x12,-1,TestBody()::kIV1);
  local_128[0] = (internal)(iVar5 != 0);
  pAStack_120 = (AssertHelperData *)0x0;
  if (!(bool)local_128[0]) {
    testing::Message::Message((Message *)local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_128,
               (AssertionResult *)
               "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x12, -1, const_cast<uint8_t *>(kIV1))","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x32f,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)local_138);
    goto LAB_00243b18;
  }
  iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x13,0x10,local_128);
  local_138[0] = (internal)(iVar5 != 0);
  local_130 = 0;
  uStack_12c = 0;
  if (iVar5 == 0) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_138,
               (AssertionResult *)"EVP_CIPHER_CTX_ctrl(ctx.get(), 0x13, sizeof(iv), iv)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x333,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_f0);
LAB_00243c3c:
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._1_7_,local_110[0]) != &local_100) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_110._1_7_,local_110[0]),local_100._M_allocated_capacity + 1)
      ;
    }
    if ((long *)local_f0.span_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_f0.span_.data_ + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT44(uStack_12c,local_130) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_130,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uStack_12c,local_130));
    }
LAB_00243f73:
    bVar4 = false;
  }
  else {
    local_130 = 0x10;
    uStack_12c = 0;
    local_f0.span_.data_ = TestBody()::kIV1;
    local_f0.span_.size_ = 0x10;
    local_138 = (undefined1  [8])local_128;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_110,"Bytes(iv)","Bytes(kIV1)",(Bytes *)local_138,&local_f0);
    if (local_110[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_138);
      if ((undefined8 *)CONCAT71(local_108._1_7_,local_108[0]) == (undefined8 *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)CONCAT71(local_108._1_7_,local_108[0]);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x334,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)local_138);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
      if (local_138 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_138 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT71(local_108._1_7_,local_108[0]) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT71(local_108._1_7_,local_108[0]));
    }
    bVar4 = testing::internal::AlwaysTrue();
    if (!bVar4) {
LAB_00243f24:
      testing::Message::Message((Message *)local_110);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_138,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x335,
                 "Expected: expect_iv(ctx.get(), kIV1, true) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_110);
LAB_00243f5b:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
      if ((long *)CONCAT71(local_110._1_7_,local_110[0]) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_110._1_7_,local_110[0]) + 8))();
      }
      goto LAB_00243f73;
    }
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      iv_07.size_ = 0x10;
      iv_07.data_ = TestBody()::kIV1;
      TestBody::anon_class_8_1_17e5c936::operator()(&local_d8,&local_b8,iv_07,true);
    }
    dVar3 = local_108[0];
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    if (dVar3 != (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0) goto LAB_00243f24;
    iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x13,0x10,local_128);
    local_138[0] = (internal)(iVar5 != 0);
    local_130 = 0;
    uStack_12c = 0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)&local_f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_110,(internal *)local_138,
                 (AssertionResult *)"EVP_CIPHER_CTX_ctrl(ctx.get(), 0x13, sizeof(iv), iv)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x338,(char *)CONCAT71(local_110._1_7_,local_110[0]));
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_f0);
      goto LAB_00243c3c;
    }
    local_130 = 0x10;
    uStack_12c = 0;
    local_f0.span_.data_ = TestBody()::kIV2;
    local_f0.span_.size_ = 0x10;
    local_138 = (undefined1  [8])local_128;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_110,"Bytes(iv)","Bytes(kIV2)",(Bytes *)local_138,&local_f0);
    if (local_110[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_138);
      if ((undefined8 *)CONCAT71(local_108._1_7_,local_108[0]) == (undefined8 *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)CONCAT71(local_108._1_7_,local_108[0]);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x339,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)local_138);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
      if (local_138 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_138 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT71(local_108._1_7_,local_108[0]) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT71(local_108._1_7_,local_108[0]));
    }
    bVar4 = testing::internal::AlwaysTrue();
    if (!bVar4) {
LAB_0024589f:
      testing::Message::Message((Message *)local_110);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_138,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x33a,
                 "Expected: expect_iv(ctx.get(), kIV2, true) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_110);
      goto LAB_00243f5b;
    }
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      iv_14.size_ = 0x10;
      iv_14.data_ = TestBody()::kIV2;
      TestBody::anon_class_8_1_17e5c936::operator()(&local_d8,&local_b8,iv_14,true);
    }
    dVar3 = local_108[0];
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    if (dVar3 != (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0) goto LAB_0024589f;
    iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x13,0x10,local_128);
    local_138[0] = (internal)(iVar5 != 0);
    local_130 = 0;
    uStack_12c = 0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)&local_f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_110,(internal *)local_138,
                 (AssertionResult *)"EVP_CIPHER_CTX_ctrl(ctx.get(), 0x13, sizeof(iv), iv)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x33d,(char *)CONCAT71(local_110._1_7_,local_110[0]));
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_f0);
      goto LAB_00243c3c;
    }
    local_130 = 0x10;
    uStack_12c = 0;
    local_f0.span_.data_ = TestBody()::kIV3;
    local_f0.span_.size_ = 0x10;
    local_138 = (undefined1  [8])local_128;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_110,"Bytes(iv)","Bytes(kIV3)",(Bytes *)local_138,&local_f0);
    if (local_110[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_138);
      if ((undefined8 *)CONCAT71(local_108._1_7_,local_108[0]) == (undefined8 *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)CONCAT71(local_108._1_7_,local_108[0]);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x33e,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)local_138);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
      if (local_138 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_138 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT71(local_108._1_7_,local_108[0]) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT71(local_108._1_7_,local_108[0]));
    }
    bVar4 = testing::internal::AlwaysTrue();
    if (!bVar4) {
LAB_00245cf0:
      testing::Message::Message((Message *)local_110);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_138,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x33f,
                 "Expected: expect_iv(ctx.get(), kIV3, true) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_110);
      goto LAB_00243f5b;
    }
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      iv_15.size_ = 0x10;
      iv_15.data_ = TestBody()::kIV3;
      TestBody::anon_class_8_1_17e5c936::operator()(&local_d8,&local_b8,iv_15,true);
    }
    dVar3 = local_108[0];
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    bVar4 = true;
    if (dVar3 != (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0) goto LAB_00245cf0;
  }
  EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&local_b8);
  if (!bVar4) {
    return;
  }
  local_138._0_4_ = 0x4030201;
  local_138._4_4_ = 0x8070605;
  local_130 = 0xc0b0a09;
  EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)&local_b8);
  iVar5 = EVP_DecryptInit_ex((EVP_CIPHER_CTX *)&local_b8,local_c8,(ENGINE *)0x0,"",(uchar *)0x0);
  local_128[0] = (internal)(iVar5 != 0);
  pAStack_120 = (AssertHelperData *)0x0;
  if (iVar5 == 0) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_128,
               (AssertionResult *)"EVP_DecryptInit_ex(ctx.get(), kCipher, nullptr, kKey, nullptr)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x34a,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_f0);
LAB_0024440d:
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._1_7_,local_110[0]) != &local_100) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_110._1_7_,local_110[0]),local_100._M_allocated_capacity + 1)
      ;
    }
    if ((long *)local_f0.span_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_f0.span_.data_ + 8))();
    }
    if (pAStack_120 != (AssertHelperData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pAStack_120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAStack_120)
      ;
    }
LAB_00244454:
    bVar4 = false;
  }
  else {
    iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x12,4,local_138);
    local_128[0] = (internal)(iVar5 != 0);
    pAStack_120 = (AssertHelperData *)0x0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)&local_f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_110,(internal *)local_128,
                 (AssertionResult *)
                 "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x12, 4, const_cast<uint8_t *>(kIV))","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x34c,(char *)CONCAT71(local_110._1_7_,local_110[0]));
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_f0);
      goto LAB_0024440d;
    }
    iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x18,8,local_138 + 4);
    local_128[0] = (internal)(iVar5 != 0);
    pAStack_120 = (AssertHelperData *)0x0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)&local_f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_110,(internal *)local_128,
                 (AssertionResult *)
                 "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x18, 8, const_cast<uint8_t *>(kIV + 4))","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x34e,(char *)CONCAT71(local_110._1_7_,local_110[0]));
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_f0);
      goto LAB_0024440d;
    }
    bVar4 = testing::internal::AlwaysTrue();
    if (!bVar4) {
LAB_00244093:
      testing::Message::Message((Message *)local_110);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_128,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x351,
                 "Expected: expect_iv(ctx.get(), kIV, false) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)local_128,(Message *)local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_128);
      if ((long *)CONCAT71(local_110._1_7_,local_110[0]) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_110._1_7_,local_110[0]) + 8))();
      }
      goto LAB_00244454;
    }
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      iv_08.size_ = 0xc;
      iv_08.data_ = local_138;
      TestBody::anon_class_8_1_17e5c936::operator()(&local_d8,&local_b8,iv_08,false);
    }
    dVar3 = local_108[0];
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    bVar4 = true;
    if (dVar3 != (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0) goto LAB_00244093;
  }
  EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&local_b8);
  if (!bVar4) {
    return;
  }
  local_128 = (undefined1  [8])&DAT_807060504030201;
  pAStack_120 = (AssertHelperData *)0x100f0e0d0c0b0a09;
  EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)&local_b8);
  iVar5 = EVP_DecryptInit_ex((EVP_CIPHER_CTX *)&local_b8,local_c8,(ENGINE *)0x0,"",(uchar *)0x0);
  iVar7 = (internal)(iVar5 != 0);
  local_130 = 0;
  uStack_12c = 0;
  local_138[0] = iVar7;
  if (iVar5 == 0) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_138,
               (AssertionResult *)"EVP_DecryptInit_ex(ctx.get(), kCipher, nullptr, kKey, nullptr)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x35b,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_f0);
LAB_002448d7:
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._1_7_,local_110[0]) != &local_100) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_110._1_7_,local_110[0]),local_100._M_allocated_capacity + 1)
      ;
    }
    if ((long *)local_f0.span_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_f0.span_.data_ + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT44(uStack_12c,local_130) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_130,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uStack_12c,local_130));
    }
LAB_0024491e:
    bVar4 = false;
  }
  else {
    iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,9,0x10,(void *)0x0);
    local_138[0] = (internal)(iVar5 != 0);
    local_130 = 0;
    uStack_12c = 0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)&local_f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_110,(internal *)local_138,
                 (AssertionResult *)"EVP_CIPHER_CTX_ctrl(ctx.get(), 0x9, sizeof(kIV), nullptr)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x35d,(char *)CONCAT71(local_110._1_7_,local_110[0]));
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_f0);
      goto LAB_002448d7;
    }
    iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x12,4,local_128);
    local_138[0] = (internal)(iVar5 != 0);
    local_130 = 0;
    uStack_12c = 0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)&local_f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_110,(internal *)local_138,
                 (AssertionResult *)
                 "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x12, 4, const_cast<uint8_t *>(kIV))","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x360,(char *)CONCAT71(local_110._1_7_,local_110[0]));
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_f0);
      goto LAB_002448d7;
    }
    iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x18,0xc,local_128 + 4);
    local_138[0] = (internal)(iVar5 != 0);
    local_130 = 0;
    uStack_12c = 0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)&local_f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_110,(internal *)local_138,
                 (AssertionResult *)
                 "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x18, 12, const_cast<uint8_t *>(kIV + 4))","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x362,(char *)CONCAT71(local_110._1_7_,local_110[0]));
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_f0);
      goto LAB_002448d7;
    }
    bVar4 = testing::internal::AlwaysTrue();
    if (!bVar4) {
LAB_00244599:
      testing::Message::Message((Message *)local_110);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_138,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x365,
                 "Expected: expect_iv(ctx.get(), kIV, false) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
      if ((long *)CONCAT71(local_110._1_7_,local_110[0]) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_110._1_7_,local_110[0]) + 8))();
      }
      goto LAB_0024491e;
    }
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      iv_10.size_ = 0x10;
      iv_10.data_ = local_128;
      TestBody::anon_class_8_1_17e5c936::operator()(&local_d8,&local_b8,iv_10,false);
    }
    dVar3 = local_108[0];
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    bVar4 = true;
    if (dVar3 != (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0) goto LAB_00244599;
  }
  EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&local_b8);
  if (!bVar4) {
    return;
  }
  local_128 = (undefined1  [8])&DAT_807060504030201;
  pAStack_120 = (AssertHelperData *)0x100f0e0d0c0b0a09;
  EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)&local_b8);
  iVar5 = EVP_DecryptInit_ex((EVP_CIPHER_CTX *)&local_b8,local_c8,(ENGINE *)0x0,"",(uchar *)0x0);
  local_138[0] = (internal)(iVar5 != 0);
  local_130 = 0;
  uStack_12c = 0;
  if (iVar5 == 0) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_138,
               (AssertionResult *)"EVP_DecryptInit_ex(ctx.get(), kCipher, nullptr, kKey, nullptr)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x36f,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_f0);
LAB_00245799:
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._1_7_,local_110[0]) != &local_100) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_110._1_7_,local_110[0]),local_100._M_allocated_capacity + 1)
      ;
    }
    if ((long *)local_f0.span_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_f0.span_.data_ + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT44(uStack_12c,local_130) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_130,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uStack_12c,local_130));
    }
    EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&local_b8);
    return;
  }
  iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x12,0,local_128);
  local_138[0] = (internal)(iVar5 == 0);
  local_130 = 0;
  uStack_12c = 0;
  if (iVar5 != 0) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_138,
               (AssertionResult *)
               "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x12, 0, const_cast<uint8_t *>(kIV))","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x373,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._1_7_,local_110[0]) != &local_100) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_110._1_7_,local_110[0]),local_100._M_allocated_capacity + 1)
      ;
    }
    if ((long *)local_f0.span_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_f0.span_.data_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_12c,local_130) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_12c,local_130));
  }
  iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x12,3,local_128);
  local_138[0] = (internal)(iVar5 == 0);
  local_130 = 0;
  uStack_12c = 0;
  if (iVar5 != 0) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_138,
               (AssertionResult *)
               "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x12, 3, const_cast<uint8_t *>(kIV))","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x375,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._1_7_,local_110[0]) != &local_100) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_110._1_7_,local_110[0]),local_100._M_allocated_capacity + 1)
      ;
    }
    if ((long *)local_f0.span_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_f0.span_.data_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_12c,local_130) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_12c,local_130));
  }
  iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x12,4,local_128);
  local_138[0] = (internal)(iVar5 != 0);
  local_130 = 0;
  uStack_12c = 0;
  if (iVar5 == 0) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_138,
               (AssertionResult *)
               "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x12, 4, const_cast<uint8_t *>(kIV))","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x377,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._1_7_,local_110[0]) != &local_100) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_110._1_7_,local_110[0]),local_100._M_allocated_capacity + 1)
      ;
    }
    if ((long *)local_f0.span_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_f0.span_.data_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_12c,local_130) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_12c,local_130));
  }
  iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x12,5,local_128);
  local_138[0] = (internal)(iVar5 == 0);
  local_130 = 0;
  uStack_12c = 0;
  if (iVar5 != 0) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_138,
               (AssertionResult *)
               "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x12, 5, const_cast<uint8_t *>(kIV))","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x379,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._1_7_,local_110[0]) != &local_100) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_110._1_7_,local_110[0]),local_100._M_allocated_capacity + 1)
      ;
    }
    if ((long *)local_f0.span_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_f0.span_.data_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_12c,local_130) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_12c,local_130));
  }
  iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x12,0x10,local_128);
  local_138[0] = (internal)(iVar5 == 0);
  local_130 = 0;
  uStack_12c = 0;
  if (iVar5 != 0) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_138,
               (AssertionResult *)
               "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x12, 16, const_cast<uint8_t *>(kIV))","true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x37b,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._1_7_,local_110[0]) != &local_100) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_110._1_7_,local_110[0]),local_100._M_allocated_capacity + 1)
      ;
    }
    if ((long *)local_f0.span_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_f0.span_.data_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_12c,local_130) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_12c,local_130));
  }
  iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,9,0x10,(void *)0x0);
  iVar7 = (internal)(iVar5 != 0);
  local_130 = 0;
  uStack_12c = 0;
  local_138[0] = iVar7;
  if (!(bool)iVar7) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_138,
               (AssertionResult *)"EVP_CIPHER_CTX_ctrl(ctx.get(), 0x9, 16, nullptr)","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x37f,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_f0);
    goto LAB_00245799;
  }
  iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x12,0,local_128);
  local_138[0] = (internal)(iVar5 == 0);
  local_130 = 0;
  uStack_12c = 0;
  if (iVar5 != 0) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_138,
               (AssertionResult *)
               "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x12, 0, const_cast<uint8_t *>(kIV))","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x381,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._1_7_,local_110[0]) != &local_100) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_110._1_7_,local_110[0]),local_100._M_allocated_capacity + 1)
      ;
    }
    if ((long *)local_f0.span_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_f0.span_.data_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_12c,local_130) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_12c,local_130));
  }
  iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x12,3,local_128);
  local_138[0] = (internal)(iVar5 == 0);
  local_130 = 0;
  uStack_12c = 0;
  if (iVar5 != 0) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_138,
               (AssertionResult *)
               "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x12, 3, const_cast<uint8_t *>(kIV))","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,899,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._1_7_,local_110[0]) != &local_100) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_110._1_7_,local_110[0]),local_100._M_allocated_capacity + 1)
      ;
    }
    if ((long *)local_f0.span_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_f0.span_.data_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_12c,local_130) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_12c,local_130));
  }
  iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x12,4,local_128);
  local_138[0] = (internal)(iVar5 != 0);
  local_130 = 0;
  uStack_12c = 0;
  if (iVar5 == 0) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_138,
               (AssertionResult *)
               "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x12, 4, const_cast<uint8_t *>(kIV))","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x385,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._1_7_,local_110[0]) != &local_100) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_110._1_7_,local_110[0]),local_100._M_allocated_capacity + 1)
      ;
    }
    if ((long *)local_f0.span_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_f0.span_.data_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_12c,local_130) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_12c,local_130));
  }
  iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x12,6,local_128);
  local_138[0] = (internal)(iVar5 != 0);
  local_130 = 0;
  uStack_12c = 0;
  if (iVar5 == 0) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_138,
               (AssertionResult *)
               "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x12, 6, const_cast<uint8_t *>(kIV))","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x387,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._1_7_,local_110[0]) != &local_100) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_110._1_7_,local_110[0]),local_100._M_allocated_capacity + 1)
      ;
    }
    if ((long *)local_f0.span_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_f0.span_.data_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_12c,local_130) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_12c,local_130));
  }
  iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x12,8,local_128);
  local_138[0] = (internal)(iVar5 != 0);
  local_130 = 0;
  uStack_12c = 0;
  if (iVar5 == 0) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_138,
               (AssertionResult *)
               "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x12, 8, const_cast<uint8_t *>(kIV))","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x389,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._1_7_,local_110[0]) != &local_100) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_110._1_7_,local_110[0]),local_100._M_allocated_capacity + 1)
      ;
    }
    if ((long *)local_f0.span_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_f0.span_.data_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_12c,local_130) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_12c,local_130));
  }
  iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x12,9,local_128);
  local_138[0] = (internal)(iVar5 == 0);
  local_130 = 0;
  uStack_12c = 0;
  if (iVar5 != 0) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_138,
               (AssertionResult *)
               "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x12, 9, const_cast<uint8_t *>(kIV))","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x38b,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._1_7_,local_110[0]) != &local_100) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_110._1_7_,local_110[0]),local_100._M_allocated_capacity + 1)
      ;
    }
    if ((long *)local_f0.span_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_f0.span_.data_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_12c,local_130) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_12c,local_130));
  }
  iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x12,0x10,local_128);
  local_138[0] = (internal)(iVar5 == 0);
  local_130 = 0;
  uStack_12c = 0;
  if (iVar5 != 0) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_138,
               (AssertionResult *)
               "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x12, 16, const_cast<uint8_t *>(kIV))","true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x38d,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._1_7_,local_110[0]) != &local_100) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_110._1_7_,local_110[0]),local_100._M_allocated_capacity + 1)
      ;
    }
    if ((long *)local_f0.span_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_f0.span_.data_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_12c,local_130) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_12c,local_130));
  }
  EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&local_b8);
  local_c0.data_._0_4_ = 0x4030201;
  EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)&local_b8);
  iVar5 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)&local_b8,local_c8,(ENGINE *)0x0,"",(uchar *)0x0);
  iVar7 = (internal)(iVar5 != 0);
  pAStack_120 = (AssertHelperData *)0x0;
  local_128[0] = iVar7;
  if (iVar5 == 0) {
    testing::Message::Message((Message *)local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_128,
               (AssertionResult *)"EVP_EncryptInit_ex(ctx.get(), kCipher, nullptr, kKey, nullptr)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x395,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)local_138);
LAB_00245a30:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._1_7_,local_110[0]) != &local_100) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_110._1_7_,local_110[0]),local_100._M_allocated_capacity + 1)
      ;
    }
    if ((long *)CONCAT44(local_138._4_4_,local_138._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_138._4_4_,local_138._0_4_) + 8))();
    }
    if (pAStack_120 != (AssertHelperData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pAStack_120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAStack_120)
      ;
    }
    EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&local_b8);
    return;
  }
  iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x12,4,&local_c0);
  local_128[0] = (internal)(iVar5 != 0);
  pAStack_120 = (AssertHelperData *)0x0;
  if (!(bool)local_128[0]) {
    testing::Message::Message((Message *)local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_128,
               (AssertionResult *)
               "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x12, sizeof(kFixedIV), const_cast<uint8_t *>(kFixedIV))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x398,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)local_138);
    goto LAB_00245a30;
  }
  iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x13,8,&local_f0);
  local_128[0] = (internal)(iVar5 != 0);
  pAStack_120 = (AssertHelperData *)0x0;
  if (iVar5 == 0) {
    testing::Message::Message((Message *)local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_128,
               (AssertionResult *)"EVP_CIPHER_CTX_ctrl(ctx.get(), 0x13, sizeof(counter), counter)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x39b,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=(&local_118,(Message *)local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._1_7_,local_110[0]) != &local_100) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_110._1_7_,local_110[0]),local_100._M_allocated_capacity + 1)
      ;
    }
    if ((long *)CONCAT44(local_138._4_4_,local_138._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_138._4_4_,local_138._0_4_) + 8))();
    }
    if (pAStack_120 != (AssertHelperData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pAStack_120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAStack_120)
      ;
    }
    EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&local_b8);
    return;
  }
  local_138._0_4_ = (uint)local_c0.data_;
  local_138._4_4_ = SUB84(local_f0.span_.data_,0);
  local_130 = (undefined4)((ulong)local_f0.span_.data_ >> 0x20);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      iv_12.size_ = 0xc;
      iv_12.data_ = local_138;
      TestBody::anon_class_8_1_17e5c936::operator()(&local_d8,&local_b8,iv_12,true);
    }
    dVar3 = local_108[0];
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    if (dVar3 != (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0) goto LAB_002454d5;
    iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x13,8,&local_118);
    local_128[0] = (internal)(iVar5 != 0);
    pAStack_120 = (AssertHelperData *)0x0;
    if (iVar5 == 0) {
      testing::Message::Message((Message *)&local_e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_110,(internal *)local_128,
                 (AssertionResult *)
                 "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x13, sizeof(counter2), counter2)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x3a5,(char *)CONCAT71(local_110._1_7_,local_110[0]));
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_110._1_7_,local_110[0]) != &local_100) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_110._1_7_,local_110[0]),
                        local_100._M_allocated_capacity + 1);
      }
      if (local_e0.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_e0.data_ + 8))();
      }
      if (pAStack_120 != (AssertHelperData *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pAStack_120,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     pAStack_120);
      }
      goto LAB_0024552a;
    }
    local_128 = (undefined1  [8])
                ((ulong)local_118.data_ >> 0x38 |
                 ((ulong)local_118.data_ & 0xff000000000000) >> 0x28 |
                 ((ulong)local_118.data_ & 0xff0000000000) >> 0x18 |
                 ((ulong)local_118.data_ & 0xff00000000) >> 8 |
                 ((ulong)local_118.data_ & 0xff000000) << 8 |
                 ((ulong)local_118.data_ & 0xff0000) << 0x18 |
                 ((ulong)local_118.data_ & 0xff00) << 0x28 | (long)local_118.data_ << 0x38);
    local_e0.data_ =
         (AssertHelperData *)
         (((ulong)local_f0.span_.data_ >> 0x38 |
           ((ulong)local_f0.span_.data_ & 0xff000000000000) >> 0x28 |
           ((ulong)local_f0.span_.data_ & 0xff0000000000) >> 0x18 |
           ((ulong)local_f0.span_.data_ & 0xff00000000) >> 8 |
           ((ulong)local_f0.span_.data_ & 0xff000000) << 8 |
           ((ulong)local_f0.span_.data_ & 0xff0000) << 0x18 |
           ((ulong)local_f0.span_.data_ & 0xff00) << 0x28 | (long)local_f0.span_.data_ << 0x38) + 1)
    ;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_110,"CRYPTO_load_u64_be(counter2)",
               "CRYPTO_load_u64_be(counter) + 1",(unsigned_long *)local_128,
               (unsigned_long *)&local_e0);
    if (local_110[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_128);
      if ((undefined8 *)CONCAT71(local_108._1_7_,local_108[0]) == (undefined8 *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)CONCAT71(local_108._1_7_,local_108[0]);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x3a6,pcVar6);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_128);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      if (local_128 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_128 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT71(local_108._1_7_,local_108[0]) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT71(local_108._1_7_,local_108[0]));
    }
    local_138._4_4_ = SUB84(local_118.data_,0);
    local_130 = (undefined4)((ulong)local_118.data_ >> 0x20);
    bVar4 = testing::internal::AlwaysTrue();
    if (!bVar4) {
LAB_002460ce:
      testing::Message::Message((Message *)local_110);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_128,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x3a8,
                 "Expected: expect_iv(ctx.get(), iv, true) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)local_128,(Message *)local_110);
      goto LAB_00245510;
    }
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      iv_16.size_ = 0xc;
      iv_16.data_ = local_138;
      TestBody::anon_class_8_1_17e5c936::operator()(&local_d8,&local_b8,iv_16,true);
    }
    dVar3 = local_108[0];
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    bVar4 = true;
    if (dVar3 != (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0) goto LAB_002460ce;
  }
  else {
LAB_002454d5:
    testing::Message::Message((Message *)local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_128,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x3a0,
               "Expected: expect_iv(ctx.get(), iv, true) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_128,(Message *)local_110);
LAB_00245510:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_128);
    if ((long *)CONCAT71(local_110._1_7_,local_110[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_110._1_7_,local_110[0]) + 8))();
    }
LAB_0024552a:
    bVar4 = false;
  }
  EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&local_b8);
  if (!bVar4) {
    return;
  }
  local_f0.span_.data_ = &DAT_807060504030201;
  EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)&local_b8);
  iVar5 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)&local_b8,local_c8,(ENGINE *)0x0,"",(uchar *)0x0);
  iVar7 = (internal)(iVar5 != 0);
  pAStack_120 = (AssertHelperData *)0x0;
  local_128[0] = iVar7;
  if (iVar5 == 0) {
    testing::Message::Message((Message *)local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_128,
               (AssertionResult *)"EVP_EncryptInit_ex(ctx.get(), kCipher, nullptr, kKey, nullptr)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x3b0,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=(&local_118,(Message *)local_138);
LAB_00245f02:
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._1_7_,local_110[0]) != &local_100) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_110._1_7_,local_110[0]),local_100._M_allocated_capacity + 1)
      ;
    }
    if ((long *)CONCAT44(local_138._4_4_,local_138._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_138._4_4_,local_138._0_4_) + 8))();
    }
    if (pAStack_120 != (AssertHelperData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pAStack_120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAStack_120)
      ;
    }
    EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&local_b8);
    return;
  }
  iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,9,0x10,(void *)0x0);
  local_128[0] = (internal)(iVar5 != 0);
  pAStack_120 = (AssertHelperData *)0x0;
  if (iVar5 == 0) {
    testing::Message::Message((Message *)local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_128,
               (AssertionResult *)
               "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x9, sizeof(kFixedIV) + 8, nullptr)","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x3b2,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=(&local_118,(Message *)local_138);
    goto LAB_00245f02;
  }
  iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x12,8,&local_f0);
  local_128[0] = (internal)(iVar5 != 0);
  pAStack_120 = (AssertHelperData *)0x0;
  if (!(bool)local_128[0]) {
    testing::Message::Message((Message *)local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_128,
               (AssertionResult *)
               "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x12, sizeof(kFixedIV), const_cast<uint8_t *>(kFixedIV))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x3b5,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=(&local_118,(Message *)local_138);
    goto LAB_00245f02;
  }
  iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x13,8,&local_118);
  local_128[0] = (internal)(iVar5 != 0);
  pAStack_120 = (AssertHelperData *)0x0;
  if (iVar5 == 0) {
    this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&pAStack_120;
    testing::Message::Message((Message *)local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_110,(internal *)local_128,
               (AssertionResult *)"EVP_CIPHER_CTX_ctrl(ctx.get(), 0x13, sizeof(counter), counter)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x3b8,(char *)CONCAT71(local_110._1_7_,local_110[0]));
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._1_7_,local_110[0]) != &local_100) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_110._1_7_,local_110[0]),local_100._M_allocated_capacity + 1)
      ;
    }
    __ptr_00 = pAStack_120;
    if ((long *)CONCAT44(local_138._4_4_,local_138._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_138._4_4_,local_138._0_4_) + 8))();
      __ptr_00 = pAStack_120;
    }
LAB_00245ff1:
    if (__ptr_00 != (AssertHelperData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __ptr_00);
    }
    goto LAB_00245ffe;
  }
  local_128 = (undefined1  [8])local_f0.span_.data_;
  pAStack_120 = local_118.data_;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      iv_13.size_ = 0x10;
      iv_13.data_ = local_128;
      TestBody::anon_class_8_1_17e5c936::operator()(&local_d8,&local_b8,iv_13,true);
    }
    dVar3 = local_108[0];
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_110);
    if (dVar3 != (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )0x0) goto LAB_0024567f;
    iVar5 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)&local_b8,0x13,8,&local_e0);
    local_138[0] = (internal)(iVar5 != 0);
    local_130 = 0;
    uStack_12c = 0;
    if (iVar5 == 0) {
      this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_130;
      testing::Message::Message((Message *)&local_d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_110,(internal *)local_138,
                 (AssertionResult *)
                 "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x13, sizeof(counter2), counter2)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x3c2,(char *)CONCAT71(local_110._1_7_,local_110[0]));
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_110._1_7_,local_110[0]) != &local_100) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_110._1_7_,local_110[0]),
                        local_100._M_allocated_capacity + 1);
      }
      if (local_d0.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_d0.data_ + 8))();
      }
      __ptr_00 = (AssertHelperData *)CONCAT44(uStack_12c,local_130);
      goto LAB_00245ff1;
    }
    uVar2 = (uint)((ulong)local_e0.data_ >> 0x18);
    uVar1 = (uint)((ulong)local_e0.data_ >> 8);
    local_138._0_4_ =
         (uint)(byte)((ulong)local_e0.data_ >> 0x38) |
         ((uint)((ulong)local_e0.data_ >> 0x20) & 0xff0000) >> 8 | uVar2 & 0xff0000 |
         uVar1 & 0xff000000;
    local_138._4_4_ =
         uVar2 & 0xff | uVar1 & 0xff00 | (uint)((((ulong)local_e0.data_ & 0xff00) << 0x28) >> 0x20)
         | (uint)((ulong)((long)local_e0.data_ << 0x38) >> 0x20);
    local_d0.data_ =
         (AssertHelperData *)
         (((ulong)local_118.data_ >> 0x38 | ((ulong)local_118.data_ & 0xff000000000000) >> 0x28 |
           ((ulong)local_118.data_ & 0xff0000000000) >> 0x18 |
           ((ulong)local_118.data_ & 0xff00000000) >> 8 | ((ulong)local_118.data_ & 0xff000000) << 8
           | ((ulong)local_118.data_ & 0xff0000) << 0x18 | ((ulong)local_118.data_ & 0xff00) << 0x28
          | (long)local_118.data_ << 0x38) + 1);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_110,"CRYPTO_load_u64_be(counter2)",
               "CRYPTO_load_u64_be(counter) + 1",(unsigned_long *)local_138,
               (unsigned_long *)&local_d0);
    if (local_110[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_138);
      if ((undefined8 *)CONCAT71(local_108._1_7_,local_108[0]) == (undefined8 *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)CONCAT71(local_108._1_7_,local_108[0]);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x3c3,pcVar6);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if ((long *)CONCAT44(local_138._4_4_,local_138._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_138._4_4_,local_138._0_4_) + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT71(local_108._1_7_,local_108[0]) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT71(local_108._1_7_,local_108[0]));
    }
    pAStack_120 = local_e0.data_;
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
                ((HasNewFatalFailureHelper *)local_110);
      bVar4 = testing::internal::AlwaysTrue();
      if (bVar4) {
        iv_17.size_ = 0x10;
        iv_17.data_ = local_128;
        TestBody::anon_class_8_1_17e5c936::operator()(&local_d8,&local_b8,iv_17,true);
      }
      testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
                ((HasNewFatalFailureHelper *)local_110);
      if (local_108[0] ==
          (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           )0x0) goto LAB_00245ffe;
    }
    testing::Message::Message((Message *)local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_138,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x3c5,
               "Expected: expect_iv(ctx.get(), iv, true) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_110);
  }
  else {
LAB_0024567f:
    testing::Message::Message((Message *)local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_138,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x3bd,
               "Expected: expect_iv(ctx.get(), iv, true) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_110);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
  if ((long *)CONCAT71(local_110._1_7_,local_110[0]) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(local_110._1_7_,local_110[0]) + 8))();
  }
LAB_00245ffe:
  EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&local_b8);
  return;
}

Assistant:

TEST(CipherTest, GCMIncrementingIV) {
  const EVP_CIPHER *kCipher = EVP_aes_128_gcm();
  static const uint8_t kKey[16] = {0, 1, 2,  3,  4,  5,  6,  7,
                                   8, 9, 10, 11, 12, 13, 14, 15};
  static const uint8_t kInput[] = {'h', 'e', 'l', 'l', 'o'};

  auto expect_iv = [&](EVP_CIPHER_CTX *ctx, bssl::Span<const uint8_t> iv,
                       bool enc) {
    // Make a reference ciphertext.
    bssl::ScopedEVP_CIPHER_CTX ref;
    ASSERT_TRUE(EVP_EncryptInit_ex(ref.get(), kCipher, /*impl=*/nullptr,
                                   kKey, /*iv=*/nullptr));
    ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ref.get(), EVP_CTRL_AEAD_SET_IVLEN,
                                    static_cast<int>(iv.size()), nullptr));
    ASSERT_TRUE(EVP_EncryptInit_ex(ref.get(), /*cipher=*/nullptr,
                                   /*impl=*/nullptr, /*key=*/nullptr,
                                   iv.data()));
    uint8_t ciphertext[sizeof(kInput)];
    int ciphertext_len;
    ASSERT_TRUE(EVP_EncryptUpdate(ref.get(), ciphertext, &ciphertext_len,
                                  kInput, sizeof(kInput)));
    int extra_len;
    ASSERT_TRUE(EVP_EncryptFinal_ex(ref.get(), nullptr, &extra_len));
    ASSERT_EQ(extra_len, 0);
    uint8_t tag[16];
    ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ref.get(), EVP_CTRL_AEAD_GET_TAG,
                                    sizeof(tag), tag));

    if (enc) {
      uint8_t actual[sizeof(kInput)];
      int actual_len;
      ASSERT_TRUE(
          EVP_EncryptUpdate(ctx, actual, &actual_len, kInput, sizeof(kInput)));
      ASSERT_TRUE(EVP_EncryptFinal_ex(ctx, nullptr, &extra_len));
      ASSERT_EQ(extra_len, 0);
      EXPECT_EQ(Bytes(actual, actual_len), Bytes(ciphertext, ciphertext_len));
      uint8_t actual_tag[16];
      ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx, EVP_CTRL_AEAD_GET_TAG,
                                      sizeof(actual_tag), actual_tag));
      EXPECT_EQ(Bytes(actual_tag), Bytes(tag));
    } else {
      ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx, EVP_CTRL_AEAD_SET_TAG, sizeof(tag),
                                      const_cast<uint8_t *>(tag)));
      uint8_t actual[sizeof(kInput)];
      int actual_len;
      ASSERT_TRUE(EVP_DecryptUpdate(ctx, actual, &actual_len, ciphertext,
                                    sizeof(ciphertext)));
      ASSERT_TRUE(EVP_DecryptFinal_ex(ctx, nullptr, &extra_len));
      ASSERT_EQ(extra_len, 0);
      EXPECT_EQ(Bytes(actual, actual_len), Bytes(kInput));
    }
  };

  {
    // Passing in a fixed IV length of -1 sets the whole IV, but then configures
    // |EVP_CIPHER_CTX| to increment the bottom 8 bytes of the IV.
    static const uint8_t kIV1[12] = {1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12};
    static const uint8_t kIV2[12] = {1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 13};
    static const uint8_t kIV3[12] = {1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 14};
    static const uint8_t kIV4[12] = {1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 15};

    bssl::ScopedEVP_CIPHER_CTX ctx;
    ASSERT_TRUE(EVP_EncryptInit_ex(ctx.get(), kCipher, /*impl=*/nullptr, kKey,
                                   /*iv=*/nullptr));
    ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_SET_IV_FIXED, -1,
                                    const_cast<uint8_t *>(kIV1)));

    // EVP_CTRL_GCM_IV_GEN both configures and returns the IV.
    uint8_t iv[12];
    ASSERT_TRUE(
        EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_GCM_IV_GEN, sizeof(iv), iv));
    EXPECT_EQ(Bytes(iv), Bytes(kIV1));
    ASSERT_NO_FATAL_FAILURE(expect_iv(ctx.get(), kIV1, /*enc=*/true));

    // Continuing to run EVP_CTRL_GCM_IV_GEN should increment the IV.
    ASSERT_TRUE(
        EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_GCM_IV_GEN, sizeof(iv), iv));
    EXPECT_EQ(Bytes(iv), Bytes(kIV2));
    ASSERT_NO_FATAL_FAILURE(expect_iv(ctx.get(), kIV2, /*enc=*/true));

    // Passing in a shorter length outputs the suffix portion.
    uint8_t suffix[8];
    ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_GCM_IV_GEN,
                                    sizeof(suffix), suffix));
    EXPECT_EQ(Bytes(suffix), Bytes(bssl::Span(kIV3).last(sizeof(suffix))));
    ASSERT_NO_FATAL_FAILURE(expect_iv(ctx.get(), kIV3, /*enc=*/true));

    // A length of -1 returns the whole IV.
    ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_GCM_IV_GEN, -1, iv));
    EXPECT_EQ(Bytes(iv), Bytes(kIV4));
    ASSERT_NO_FATAL_FAILURE(expect_iv(ctx.get(), kIV4, /*enc=*/true));
  }

  {
    // Similar to the above, but for decrypting.
    static const uint8_t kIV1[12] = {1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12};
    static const uint8_t kIV2[12] = {1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 13};

    bssl::ScopedEVP_CIPHER_CTX ctx;
    ASSERT_TRUE(EVP_DecryptInit_ex(ctx.get(), kCipher, /*impl=*/nullptr, kKey,
                                   /*iv=*/nullptr));
    ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_SET_IV_FIXED, -1,
                                    const_cast<uint8_t *>(kIV1)));

    uint8_t iv[12];
    ASSERT_TRUE(
        EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_GCM_IV_GEN, sizeof(iv), iv));
    EXPECT_EQ(Bytes(iv), Bytes(kIV1));
    ASSERT_NO_FATAL_FAILURE(expect_iv(ctx.get(), kIV1, /*enc=*/false));

    ASSERT_TRUE(
        EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_GCM_IV_GEN, sizeof(iv), iv));
    EXPECT_EQ(Bytes(iv), Bytes(kIV2));
    ASSERT_NO_FATAL_FAILURE(expect_iv(ctx.get(), kIV2, /*enc=*/false));
  }

  {
    // Test that only the bottom 8 bytes are used as a counter.
    static const uint8_t kIV1[12] = {0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
                                     0xff, 0xff, 0xff, 0xff, 0xff, 0xff};
    static const uint8_t kIV2[12] = {0xff, 0xff, 0xff, 0xff, 0x00, 0x00,
                                     0x00, 0x00, 0x00, 0x00, 0x00, 0x00};
    static const uint8_t kIV3[12] = {0xff, 0xff, 0xff, 0xff, 0x00, 0x00,
                                     0x00, 0x00, 0x00, 0x00, 0x00, 0x01};

    bssl::ScopedEVP_CIPHER_CTX ctx;
    ASSERT_TRUE(EVP_EncryptInit_ex(ctx.get(), kCipher, /*impl=*/nullptr, kKey,
                                   /*iv=*/nullptr));
    ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_SET_IV_FIXED, -1,
                                    const_cast<uint8_t *>(kIV1)));

    uint8_t iv[12];
    ASSERT_TRUE(
        EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_GCM_IV_GEN, sizeof(iv), iv));
    EXPECT_EQ(Bytes(iv), Bytes(kIV1));
    ASSERT_NO_FATAL_FAILURE(expect_iv(ctx.get(), kIV1, /*enc=*/true));

    ASSERT_TRUE(
        EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_GCM_IV_GEN, sizeof(iv), iv));
    EXPECT_EQ(Bytes(iv), Bytes(kIV2));
    ASSERT_NO_FATAL_FAILURE(expect_iv(ctx.get(), kIV2, /*enc=*/true));

    ASSERT_TRUE(
        EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_GCM_IV_GEN, sizeof(iv), iv));
    EXPECT_EQ(Bytes(iv), Bytes(kIV3));
    ASSERT_NO_FATAL_FAILURE(expect_iv(ctx.get(), kIV3, /*enc=*/true));
  }

  {
    // Test with a longer IV length.
    static const uint8_t kIV1[16] = {0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
                                     0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
                                     0xff, 0xff, 0xff, 0xff};
    static const uint8_t kIV2[16] = {0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
                                     0xff, 0xff, 0x00, 0x00, 0x00, 0x00,
                                     0x00, 0x00, 0x00, 0x00};
    static const uint8_t kIV3[16] = {0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
                                     0xff, 0xff, 0x00, 0x00, 0x00, 0x00,
                                     0x00, 0x00, 0x00, 0x01};

    bssl::ScopedEVP_CIPHER_CTX ctx;
    ASSERT_TRUE(EVP_EncryptInit_ex(ctx.get(), kCipher, /*impl=*/nullptr, kKey,
                                   /*iv=*/nullptr));
    ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_SET_IVLEN,
                                    sizeof(kIV1), nullptr));
    ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_SET_IV_FIXED, -1,
                                    const_cast<uint8_t *>(kIV1)));

    uint8_t iv[16];
    ASSERT_TRUE(
        EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_GCM_IV_GEN, sizeof(iv), iv));
    EXPECT_EQ(Bytes(iv), Bytes(kIV1));
    ASSERT_NO_FATAL_FAILURE(expect_iv(ctx.get(), kIV1, /*enc=*/true));

    ASSERT_TRUE(
        EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_GCM_IV_GEN, sizeof(iv), iv));
    EXPECT_EQ(Bytes(iv), Bytes(kIV2));
    ASSERT_NO_FATAL_FAILURE(expect_iv(ctx.get(), kIV2, /*enc=*/true));

    ASSERT_TRUE(
        EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_GCM_IV_GEN, sizeof(iv), iv));
    EXPECT_EQ(Bytes(iv), Bytes(kIV3));
    ASSERT_NO_FATAL_FAILURE(expect_iv(ctx.get(), kIV3, /*enc=*/true));
  }

  {
    // When decrypting, callers are expected to configure the fixed half and
    // invocation half separately. The two will get stitched together into the
    // final IV.
    const uint8_t kIV[12] = {1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12};

    bssl::ScopedEVP_CIPHER_CTX ctx;
    ASSERT_TRUE(EVP_DecryptInit_ex(ctx.get(), kCipher, /*impl=*/nullptr, kKey,
                                   /*iv=*/nullptr));
    ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_SET_IV_FIXED, 4,
                                    const_cast<uint8_t *>(kIV)));
    ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_GCM_SET_IV_INV, 8,
                                    const_cast<uint8_t *>(kIV + 4)));
    // EVP_CTRL_GCM_SET_IV_INV is sufficient to configure the IV. There is no
    // need to call EVP_CTRL_GCM_IV_GEN.
    ASSERT_NO_FATAL_FAILURE(expect_iv(ctx.get(), kIV, /*enc=*/false));
  }

  {
    // Stitching together a decryption IV that exceeds the standard IV length.
    const uint8_t kIV[16] = {1, 2,  3,  4,  5,  6,  7,  8,
                             9, 10, 11, 12, 13, 14, 15, 16};

    bssl::ScopedEVP_CIPHER_CTX ctx;
    ASSERT_TRUE(EVP_DecryptInit_ex(ctx.get(), kCipher, /*impl=*/nullptr, kKey,
                                   /*iv=*/nullptr));
    ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_SET_IVLEN,
                                    sizeof(kIV), nullptr));

    ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_SET_IV_FIXED, 4,
                                    const_cast<uint8_t *>(kIV)));
    ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_GCM_SET_IV_INV, 12,
                                    const_cast<uint8_t *>(kIV + 4)));
    // EVP_CTRL_GCM_SET_IV_INV is sufficient to configure the IV. There is no
    // need to call EVP_CTRL_GCM_IV_GEN.
    ASSERT_NO_FATAL_FAILURE(expect_iv(ctx.get(), kIV, /*enc=*/false));
  }

  {
    // Fixed IVs must be at least 4 bytes and admit at least an 8 byte counter.
    const uint8_t kIV[16] = {1, 2,  3,  4,  5,  6,  7,  8,
                             9, 10, 11, 12, 13, 14, 15, 16};

    bssl::ScopedEVP_CIPHER_CTX ctx;
    ASSERT_TRUE(EVP_DecryptInit_ex(ctx.get(), kCipher, /*impl=*/nullptr, kKey,
                                   /*iv=*/nullptr));

    // This means the default IV length only allows a 4/8 split.
    EXPECT_FALSE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_SET_IV_FIXED, 0,
                                     const_cast<uint8_t *>(kIV)));
    EXPECT_FALSE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_SET_IV_FIXED, 3,
                                     const_cast<uint8_t *>(kIV)));
    EXPECT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_SET_IV_FIXED, 4,
                                    const_cast<uint8_t *>(kIV)));
    EXPECT_FALSE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_SET_IV_FIXED, 5,
                                     const_cast<uint8_t *>(kIV)));
    EXPECT_FALSE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_SET_IV_FIXED, 16,
                                     const_cast<uint8_t *>(kIV)));

    // A longer IV allows a wider range.
    ASSERT_TRUE(
        EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_SET_IVLEN, 16, nullptr));
    EXPECT_FALSE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_SET_IV_FIXED, 0,
                                     const_cast<uint8_t *>(kIV)));
    EXPECT_FALSE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_SET_IV_FIXED, 3,
                                     const_cast<uint8_t *>(kIV)));
    EXPECT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_SET_IV_FIXED, 4,
                                    const_cast<uint8_t *>(kIV)));
    EXPECT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_SET_IV_FIXED, 6,
                                    const_cast<uint8_t *>(kIV)));
    EXPECT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_SET_IV_FIXED, 8,
                                    const_cast<uint8_t *>(kIV)));
    EXPECT_FALSE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_SET_IV_FIXED, 9,
                                     const_cast<uint8_t *>(kIV)));
    EXPECT_FALSE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_SET_IV_FIXED, 16,
                                     const_cast<uint8_t *>(kIV)));
  }

  {
    // When encrypting, setting a fixed IV randomizes the counter portion.
    const uint8_t kFixedIV[4] = {1, 2, 3, 4};
    bssl::ScopedEVP_CIPHER_CTX ctx;
    ASSERT_TRUE(EVP_EncryptInit_ex(ctx.get(), kCipher, /*impl=*/nullptr, kKey,
                                   /*iv=*/nullptr));
    ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_SET_IV_FIXED,
                                    sizeof(kFixedIV),
                                    const_cast<uint8_t *>(kFixedIV)));
    uint8_t counter[8];
    ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_GCM_IV_GEN,
                                    sizeof(counter), counter));

    uint8_t iv[12];
    memcpy(iv, kFixedIV, sizeof(kFixedIV));
    memcpy(iv + sizeof(kFixedIV), counter, sizeof(counter));
    ASSERT_NO_FATAL_FAILURE(expect_iv(ctx.get(), iv, /*enc=*/true));

    // The counter continues to act as a counter.
    uint8_t counter2[8];
    ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_GCM_IV_GEN,
                                    sizeof(counter2), counter2));
    EXPECT_EQ(CRYPTO_load_u64_be(counter2), CRYPTO_load_u64_be(counter) + 1);
    memcpy(iv + sizeof(kFixedIV), counter2, sizeof(counter2));
    ASSERT_NO_FATAL_FAILURE(expect_iv(ctx.get(), iv, /*enc=*/true));
  }

    {
    // Same as above, but with a larger IV.
    const uint8_t kFixedIV[8] = {1, 2, 3, 4, 5, 6, 7, 8};
    bssl::ScopedEVP_CIPHER_CTX ctx;
    ASSERT_TRUE(EVP_EncryptInit_ex(ctx.get(), kCipher, /*impl=*/nullptr, kKey,
                                   /*iv=*/nullptr));
    ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_SET_IVLEN,
                                    sizeof(kFixedIV) + 8, nullptr));
    ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_SET_IV_FIXED,
                                    sizeof(kFixedIV),
                                    const_cast<uint8_t *>(kFixedIV)));
    uint8_t counter[8];
    ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_GCM_IV_GEN,
                                    sizeof(counter), counter));

    uint8_t iv[16];
    memcpy(iv, kFixedIV, sizeof(kFixedIV));
    memcpy(iv + sizeof(kFixedIV), counter, sizeof(counter));
    ASSERT_NO_FATAL_FAILURE(expect_iv(ctx.get(), iv, /*enc=*/true));

    // The counter continues to act as a counter.
    uint8_t counter2[8];
    ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_GCM_IV_GEN,
                                    sizeof(counter2), counter2));
    EXPECT_EQ(CRYPTO_load_u64_be(counter2), CRYPTO_load_u64_be(counter) + 1);
    memcpy(iv + sizeof(kFixedIV), counter2, sizeof(counter2));
    ASSERT_NO_FATAL_FAILURE(expect_iv(ctx.get(), iv, /*enc=*/true));
  }
}